

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_newlock(CHAR_DATA *ch,char *argument)

{
  char *string;
  char *txt;
  
  string = "$N locks out new characters.";
  if (newlock) {
    string = "$N allows new characters back in.";
  }
  txt = "New characters have been locked out.\n\r";
  if (newlock) {
    txt = "Newlock removed.\n\r";
  }
  newlock = !newlock;
  wiznet(string,ch,(OBJ_DATA *)0x0,0,0,0);
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_newlock(CHAR_DATA *ch, char *argument)
{
	newlock = !newlock;

	if (newlock)
	{
		wiznet("$N locks out new characters.", ch, nullptr, 0, 0, 0);
		send_to_char("New characters have been locked out.\n\r", ch);
	}
	else
	{
		wiznet("$N allows new characters back in.", ch, nullptr, 0, 0, 0);
		send_to_char("Newlock removed.\n\r", ch);
	}
}